

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_free(ptls_t *tls)

{
  st_ptls_aead_context_t *psVar1;
  ptls_key_exchange_context_t *ppVar2;
  uint8_t *__ptr;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var3;
  st_ptls_update_open_count_t *psVar4;
  
  ptls_buffer__release_memory(&(tls->recvbuf).rec);
  (tls->recvbuf).rec.off = 0;
  *(undefined8 *)&(tls->recvbuf).rec.is_allocated = 0;
  (tls->recvbuf).rec.base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  ptls_buffer__release_memory(&(tls->recvbuf).mess);
  (tls->recvbuf).mess.off = 0;
  *(undefined8 *)&(tls->recvbuf).mess.is_allocated = 0;
  (tls->recvbuf).mess.base = (uint8_t *)0x0;
  (tls->recvbuf).mess.capacity = 0;
  free_exporter_master_secret(tls,1);
  free_exporter_master_secret(tls,0);
  if (tls->key_schedule != (ptls_key_schedule_t *)0x0) {
    key_schedule_free(tls->key_schedule);
  }
  psVar1 = (tls->traffic_protection).dec.aead;
  if (psVar1 != (st_ptls_aead_context_t *)0x0) {
    (*psVar1->dispose_crypto)(psVar1);
    (*ptls_clear_memory)(psVar1->static_iv,psVar1->algo->iv_size);
    free(psVar1);
  }
  psVar1 = (tls->traffic_protection).enc.aead;
  if (psVar1 != (st_ptls_aead_context_t *)0x0) {
    (*psVar1->dispose_crypto)(psVar1);
    (*ptls_clear_memory)(psVar1->static_iv,psVar1->algo->iv_size);
    free(psVar1);
  }
  free(tls->server_name);
  free(tls->negotiated_protocol);
  if ((tls->field_0x148 & 1) == 0) {
    ppVar2 = (tls->field_16).client.key_share_ctx;
    if (ppVar2 != (ptls_key_exchange_context_t *)0x0) {
      (*ppVar2->on_exchange)
                (&(tls->field_16).client.key_share_ctx,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0))
      ;
    }
    __ptr = (tls->field_16).client.certificate_request.context.base;
    if (__ptr != (uint8_t *)0x0) {
      free(__ptr);
    }
  }
  p_Var3 = (tls->certificate_verify).cb;
  if (p_Var3 != (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
    (*p_Var3)((tls->certificate_verify).verify_ctx,(ptls_iovec_t)ZEXT816(0),(ptls_iovec_t)ZEXT816(0)
             );
  }
  if (tls->early_data != (st_ptls_early_data_t *)0x0) {
    (*ptls_clear_memory)(tls->early_data,0x40);
    free(tls->early_data);
  }
  psVar4 = tls->ctx->update_open_count;
  if (psVar4 != (st_ptls_update_open_count_t *)0x0) {
    (*psVar4->cb)(psVar4,-1);
  }
  (*ptls_clear_memory)(tls,0x1e8);
  free(tls);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    free_exporter_master_secret(tls, 1);
    free_exporter_master_secret(tls, 0);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    free(tls->negotiated_protocol);
    if (tls->is_server) {
        /* nothing to do */
    } else {
        if (tls->client.key_share_ctx != NULL)
            tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, NULL, ptls_iovec_init(NULL, 0));
        if (tls->client.certificate_request.context.base != NULL)
            free(tls->client.certificate_request.context.base);
    }
    if (tls->certificate_verify.cb != NULL) {
        tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, ptls_iovec_init(NULL, 0), ptls_iovec_init(NULL, 0));
    }
    if (tls->early_data != NULL) {
        ptls_clear_memory(tls->early_data, sizeof(*tls->early_data));
        free(tls->early_data);
    }
    update_open_count(tls->ctx, -1);
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}